

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O1

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command_conflict *commands,size_t n_commands,
               BlockSplitFromDecoder *literals_block_splits,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  size_t __n;
  undefined1 auVar5 [16];
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *__dest;
  uint32_t *puVar9;
  HistogramLiteral *__s;
  Command_conflict *pCVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  HistogramCommand **in_stack_fffffffffffffd48;
  MemoryManager *pMVar18;
  BlockSplitterCommand cmd_blocks;
  anon_union_336_2_32013c24 lit_blocks;
  BlockSplitterDistance dist_blocks;
  
  if (num_contexts == 1) {
    sVar12 = 0;
    sVar6 = n_commands;
    pCVar10 = commands;
    if (n_commands != 0) {
      do {
        sVar12 = sVar12 + pCVar10->insert_len_;
        sVar6 = sVar6 - 1;
        pCVar10 = pCVar10 + 1;
      } while (sVar6 != 0);
    }
    pMVar18 = m;
    InitBlockSplitterLiteral
              (m,&lit_blocks.plain,sVar12,(size_t)mb,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)in_stack_fffffffffffffd48,(size_t *)m);
    uVar16 = extraout_XMM0_Da;
    uVar17 = extraout_XMM0_Db;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.num_types_ = 0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.plain.split_,literals_block_splits,
                 current_block_literals);
      uVar16 = extraout_XMM0_Da_00;
      uVar17 = extraout_XMM0_Db_00;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar17,uVar16),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               in_stack_fffffffffffffd48,(size_t *)pMVar18);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd48,(size_t *)pMVar18);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    if (n_commands != 0) {
      sVar6 = 0;
      do {
        uVar13 = (ulong)commands[sVar6].insert_len_;
        uVar14 = commands[sVar6].copy_len_;
        uVar2 = commands[sVar6].cmd_prefix_;
        uVar7 = (ulong)commands[sVar6].dist_prefix_;
        if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        else {
          BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        for (; uVar13 != 0; uVar13 = uVar13 - 1) {
          if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
            BlockSplitterAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
          }
          else {
            BlockSplitterStoredAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
          }
          pos = pos + 1;
        }
        uVar14 = uVar14 & 0x1ffffff;
        if ((uVar14 != 0) && (0x7f < uVar2)) {
          BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)((uint)uVar7 & 0x3ff));
        }
        pos = pos + uVar14;
        sVar6 = sVar6 + 1;
      } while (sVar6 != n_commands);
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockLiteral(&lit_blocks.plain,1);
    }
    else {
      BlockSplitterStoredFinishBlockLiteral(&lit_blocks.plain,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
  }
  else {
    uVar7 = 0;
    pCVar10 = commands;
    sVar6 = n_commands;
    if (n_commands != 0) {
      do {
        uVar7 = uVar7 + pCVar10->insert_len_;
        sVar6 = sVar6 - 1;
        pCVar10 = pCVar10 + 1;
      } while (sVar6 != 0);
      uVar7 = uVar7 >> 9;
    }
    lit_blocks.ctx.histograms_size_ = &mb->literal_histograms_size;
    uVar13 = 0x3ff;
    if (0x3ff < uVar7) {
      uVar13 = uVar7;
    }
    uVar7 = uVar13 + 1;
    lit_blocks.plain.alphabet_size_ = 0x100;
    lit_blocks.plain.min_block_size_ = num_contexts;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = num_contexts;
    lit_blocks.ctx.max_block_types_ = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar5,0);
    lit_blocks.plain.num_blocks_ = 0x200;
    lit_blocks.plain.num_types_ = 0x4079000000000000;
    lit_blocks.plain.split_ = (BlockSplit *)0x0;
    lit_blocks.ctx.split_ = &mb->literal_split;
    lit_blocks.plain.curr_histogram_ix_ = 0x200;
    lit_blocks.ctx.merge_last_count_ = 0;
    uVar8 = lit_blocks.ctx.max_block_types_ + 1;
    if (uVar7 < lit_blocks.ctx.max_block_types_ + 1) {
      uVar8 = uVar7;
    }
    lit_blocks.plain.last_histogram_ix_[0] = 0;
    lit_blocks.plain.last_histogram_ix_[1] = 0;
    uVar4 = (mb->literal_split).types_alloc_size;
    if (uVar4 <= uVar13) {
      if (uVar4 == 0) {
        uVar4 = uVar7;
      }
      do {
        uVar11 = uVar4;
        uVar4 = uVar11 * 2;
      } while (uVar11 <= uVar13);
      __dest = (uint8_t *)BrotliAllocate(m,uVar11);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        memcpy(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar11;
    }
    uVar4 = (mb->literal_split).lengths_alloc_size;
    if (uVar4 <= uVar13) {
      if (uVar4 == 0) {
        uVar4 = uVar7;
      }
      do {
        uVar11 = uVar4;
        uVar4 = uVar11 * 2;
      } while (uVar11 <= uVar13);
      puVar9 = (uint32_t *)BrotliAllocate(m,uVar11 * 4);
      sVar6 = (mb->literal_split).lengths_alloc_size;
      if (sVar6 != 0) {
        memcpy(puVar9,(mb->literal_split).lengths,sVar6 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar9;
      (mb->literal_split).lengths_alloc_size = uVar11;
    }
    (mb->literal_split).num_blocks = uVar7;
    sVar6 = uVar8 * num_contexts;
    mb->literal_histograms_size = sVar6;
    if (sVar6 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar6 * 0x410);
    }
    mb->literal_histograms = __s;
    lVar15 = num_contexts + (num_contexts == 0);
    lit_blocks.ctx.histograms_ = __s;
    do {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    uVar16 = 0;
    uVar17 = 0;
    lit_blocks.plain.last_entropy_[0] = 0.0;
    lit_blocks.plain.last_entropy_[1] = 0.0;
    pMVar18 = m;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.histograms_ = (HistogramLiteral *)0x0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.ctx.split_,literals_block_splits,
                 current_block_literals);
      uVar16 = extraout_XMM0_Da_02;
      uVar17 = extraout_XMM0_Db_02;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar17,uVar16),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               in_stack_fffffffffffffd48,(size_t *)pMVar18);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd48,(size_t *)pMVar18);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    if (n_commands != 0) {
      sVar6 = 0;
      do {
        uVar7 = (ulong)commands[sVar6].insert_len_;
        uVar14 = commands[sVar6].copy_len_;
        uVar2 = commands[sVar6].cmd_prefix_;
        uVar3 = commands[sVar6].dist_prefix_;
        bVar1 = prev_byte;
        if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        else {
          BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        for (; prev_byte = bVar1, uVar7 != 0; uVar7 = uVar7 - 1) {
          bVar1 = ringbuffer[pos & mask];
          uVar13 = (ulong)static_context_map
                          [literal_context_lut[(ulong)prev_byte2 + 0x100] |
                           literal_context_lut[prev_byte]];
          if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
            ((HistogramLiteral *)
            ((long)lit_blocks.ctx.histograms_ +
            (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->data_[bVar1] =
                 ((HistogramLiteral *)
                 ((long)lit_blocks.ctx.histograms_ +
                 (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->data_[bVar1] + 1;
            ((HistogramLiteral *)
            ((long)lit_blocks.ctx.histograms_ +
            (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->total_count_ =
                 ((HistogramLiteral *)
                 ((long)lit_blocks.ctx.histograms_ +
                 (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->total_count_ + 1;
            lit_blocks.plain.last_histogram_ix_[0] = lit_blocks.plain.last_histogram_ix_[0] + 1;
            if (lit_blocks.plain.last_histogram_ix_[0] == lit_blocks.plain.curr_histogram_ix_) {
              ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar18,0);
            }
          }
          else {
            ((HistogramLiteral *)
            ((long)lit_blocks.ctx.histograms_ +
            (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->data_[bVar1] =
                 ((HistogramLiteral *)
                 ((long)lit_blocks.ctx.histograms_ +
                 (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->data_[bVar1] + 1;
            ((HistogramLiteral *)
            ((long)lit_blocks.ctx.histograms_ +
            (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->total_count_ =
                 ((HistogramLiteral *)
                 ((long)lit_blocks.ctx.histograms_ +
                 (lit_blocks.plain.last_histogram_ix_[1] + uVar13) * 0x410))->total_count_ + 1;
            lit_blocks.plain.last_histogram_ix_[0] = lit_blocks.plain.last_histogram_ix_[0] + 1;
            if (lit_blocks.plain.last_histogram_ix_[0] ==
                (lit_blocks.ctx.split_)->lengths[lit_blocks.ctx.num_blocks_]) {
              ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar18,0);
            }
          }
          pos = pos + 1;
          prev_byte2 = prev_byte;
        }
        uVar7 = (ulong)(uVar14 & 0x1ffffff);
        pos = pos + uVar7;
        if (uVar7 != 0) {
          prev_byte2 = ringbuffer[pos - 2 & mask];
          prev_byte = ringbuffer[pos - 1 & mask];
          if (0x7f < uVar2) {
            BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar3 & 0x3ff));
          }
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != n_commands);
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar18,1);
    }
    else {
      ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar18,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
    sVar6 = (mb->literal_split).num_types;
    sVar12 = sVar6 << 6;
    mb->literal_context_map_size = sVar12;
    if (sVar12 == 0) {
      puVar9 = (uint32_t *)0x0;
    }
    else {
      puVar9 = (uint32_t *)BrotliAllocate(pMVar18,sVar6 << 8);
    }
    mb->literal_context_map = puVar9;
    sVar6 = (mb->literal_split).num_types;
    if (sVar6 != 0) {
      sVar12 = 0;
      do {
        lVar15 = 0;
        do {
          puVar9[lVar15] = static_context_map[lVar15] + (int)sVar12 * (int)num_contexts;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        sVar12 = sVar12 + 1;
        puVar9 = puVar9 + 0x40;
      } while (sVar12 != sVar6);
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                const BlockSplitFromDecoder* literals_block_splits,
                                size_t* current_block_literals,
                                const BlockSplitFromDecoder* cmds_block_splits,
                                size_t* current_block_cmds,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands,
        literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  }
}